

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other)

{
  undefined8 *puVar1;
  ulong nbCols;
  long lVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  long lVar5;
  undefined8 *puVar6;
  Index index;
  ulong uVar7;
  long lVar8;
  
  uVar7 = *(ulong *)(other + 8);
  nbCols = *(ulong *)(other + 0x10);
  if ((nbCols != 0 && uVar7 != 0) &&
     (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar3 / SEXT816((long)nbCols),0) < (long)uVar7)) {
    puVar6 = (undefined8 *)
             __cxa_allocate_exception(8,other,SUB168(auVar3 % SEXT816((long)nbCols),0));
    *puVar6 = operator_delete;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if ((long)(nbCols | uVar7) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * uVar7,uVar7,nbCols);
  if ((*(long *)(this + 8) == *(long *)(other + 8)) &&
     (*(long *)(this + 0x10) == *(long *)(other + 0x10))) {
    lVar5 = *(long *)(this + 0x10) * *(long *)(this + 8);
    uVar7 = lVar5 - (lVar5 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar5) {
      lVar8 = 0;
      do {
        puVar6 = (undefined8 *)(*(long *)other + lVar8 * 8);
        uVar4 = puVar6[1];
        puVar1 = (undefined8 *)(*(long *)this + lVar8 * 8);
        *puVar1 = *puVar6;
        puVar1[1] = uVar4;
        lVar8 = lVar8 + 2;
      } while (lVar8 < (long)uVar7);
    }
    if ((long)uVar7 < lVar5) {
      lVar8 = *(long *)other;
      lVar2 = *(long *)this;
      do {
        *(undefined8 *)(lVar2 + uVar7 * 8) = *(undefined8 *)(lVar8 + uVar7 * 8);
        uVar7 = uVar7 + 1;
      } while (lVar5 - uVar7 != 0);
    }
    return (Matrix<double,__1,__1,_0,__1,__1> *)this;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/Assign.h"
                ,0x1f2,
                "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }